

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O3

Constraint *
create_does_not_end_with_string_constraint(char *expected_value,char *expected_value_name)

{
  Constraint *pCVar1;
  char *pcVar2;
  CgreenValue local_30;
  
  make_cgreen_string_value(&local_30,expected_value);
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->failure_message = failure_message_for;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  (pCVar1->expected_value).type = local_30.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_30._4_4_;
  (pCVar1->expected_value).value = local_30.value;
  (pCVar1->expected_value).value_size = local_30.value_size;
  pcVar2 = string_dup(expected_value_name);
  pCVar1->expected_value_name = pcVar2;
  pCVar1->type = CGREEN_STRING_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_do_not_want_end_of_string;
  pCVar1->execute = test_want;
  pCVar1->name = "not end with string";
  pCVar1->destroy = destroy_string_constraint;
  pCVar1->expected_value_message = "\t\texpected to not end with:\t[\"%s\"]";
  return pCVar1;
}

Assistant:

Constraint *create_does_not_end_with_string_constraint(const char* expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_string_value(expected_value), expected_value_name);
    constraint->type = CGREEN_STRING_COMPARER_CONSTRAINT;

    constraint->compare = &compare_do_not_want_end_of_string;
    constraint->execute = &test_want;
    constraint->name = "not end with string";
    constraint->destroy = &destroy_string_constraint;
    constraint->expected_value_message = "\t\texpected to not end with:\t[\"%s\"]";

    return constraint;
}